

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicitTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitTypeSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1,Token *args_2)

{
  Token placeholder;
  Token signing;
  ImplicitTypeSyntax *pIVar1;
  ImplicitTypeSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pIVar1 = (ImplicitTypeSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  signing.info = unaff_retaddr;
  signing.kind = (short)in_RDI;
  signing._2_1_ = (char)((ulong)in_RDI >> 0x10);
  signing.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  signing.rawLen = (int)((ulong)in_RDI >> 0x20);
  placeholder.info = in_RSI;
  placeholder.kind = (short)in_RDX;
  placeholder._2_1_ = (char)((ulong)in_RDX >> 0x10);
  placeholder.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  placeholder.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ImplicitTypeSyntax::ImplicitTypeSyntax
            (in_RCX,signing,(SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_RSI->location,
             placeholder);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }